

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

void __thiscall
icu_63::GregorianCalendar::handleComputeFields
          (GregorianCalendar *this,int32_t julianDay,UErrorCode *status)

{
  uint uVar1;
  uint uVar2;
  int32_t iVar3;
  int64_t iVar4;
  int64_t iVar5;
  int iVar6;
  int iVar7;
  int16_t *piVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  int32_t unusedRemainder;
  int32_t local_34;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  iVar6 = this->fCutoverJulianDay;
  if (julianDay < iVar6) {
    uVar2 = ClockMath::floorDivide((double)(julianDay + -0x1a4450) * 4.0 + 1464.0,0x5b5,&local_34);
    iVar3 = ClockMath::floorDivide(uVar2 - 1,4);
    iVar6 = (uVar2 - 1) * -0x16d;
    iVar10 = (julianDay + -0x1a4450) - iVar3;
    iVar7 = iVar10 + iVar6;
    bVar11 = (uVar2 & 3) == 0;
    piVar8 = kNumDays;
    if (bVar11) {
      piVar8 = kLeapNumDays;
    }
    uVar1 = (uint)bVar11;
    iVar9 = 0;
    if ((int)(uVar1 + 0x3b) <= iVar7) {
      iVar9 = 2 - uVar1;
    }
    iVar9 = ((iVar9 + iVar7) * 0xc + 6) / 0x16f;
    iVar7 = (iVar7 - piVar8[iVar9]) + 1;
    iVar10 = iVar10 + iVar6 + 1;
    iVar6 = this->fCutoverJulianDay;
  }
  else {
    uVar2 = (this->super_Calendar).fGregorianYear;
    iVar9 = (this->super_Calendar).fGregorianMonth;
    iVar7 = (this->super_Calendar).fGregorianDayOfMonth;
    iVar10 = (this->super_Calendar).fGregorianDayOfYear;
  }
  if ((uVar2 == this->fGregorianCutoverYear) && (iVar6 <= julianDay)) {
    iVar4 = ClockMath::floorDivide((long)(int)uVar2 + -1,400);
    iVar5 = ClockMath::floorDivide((long)(int)uVar2 + -1,100);
    iVar10 = iVar10 + ((int)iVar4 - (int)iVar5) + 2;
  }
  (this->super_Calendar).fFields[2] = iVar9;
  (this->super_Calendar).fStamp[2] = 1;
  (this->super_Calendar).fIsSet[2] = '\x01';
  (this->super_Calendar).fFields[5] = iVar7;
  (this->super_Calendar).fStamp[5] = 1;
  (this->super_Calendar).fStamp[6] = 1;
  (this->super_Calendar).fIsSet[5] = '\x01';
  (this->super_Calendar).fIsSet[6] = '\x01';
  (this->super_Calendar).fFields[6] = iVar10;
  (this->super_Calendar).fFields[0x13] = uVar2;
  (this->super_Calendar).fStamp[0x13] = 1;
  (this->super_Calendar).fIsSet[0x13] = '\x01';
  uVar1 = 1 - uVar2;
  if (0 < (int)uVar2) {
    uVar1 = uVar2;
  }
  (this->super_Calendar).fFields[0] = (uint)(0 < (int)uVar2);
  (this->super_Calendar).fStamp[0] = 1;
  (this->super_Calendar).fStamp[1] = 1;
  (this->super_Calendar).fIsSet[0] = '\x01';
  (this->super_Calendar).fIsSet[1] = '\x01';
  (this->super_Calendar).fFields[1] = uVar1;
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }